

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::SectionTracking::TestCaseTracker::~TestCaseTracker(TestCaseTracker *this)

{
  TestCaseTracker *this_local;
  
  TrackedSection::~TrackedSection(&this->m_testCase);
  return;
}

Assistant:

TestCaseTracker( std::string const& testCaseName )
        :   m_testCase( testCaseName, NULL ),
            m_currentSection( &m_testCase ),
            m_completedASectionThisRun( false )
        {}